

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUnixThread_New(PaUnixThread *self,_func_void_ptr_void_ptr *threadFunc,void *threadArg,
                        PaTime waitForChild,int rtSched)

{
  double dVar1;
  int iVar2;
  int in_ECX;
  void *in_RDX;
  __start_routine *in_RSI;
  pthread_t *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  PaTime now;
  int res;
  timespec ts;
  PaTime till;
  sched_param spm;
  int policy;
  int started;
  pthread_attr_t attr;
  PaError result;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined7 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffff68;
  int wait;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  timespec local_88;
  double local_78;
  sched_param local_6c;
  int local_68;
  int local_64;
  pthread_attr_t local_60;
  PaError local_28;
  int local_24;
  double local_20;
  void *local_18;
  __start_routine *local_10;
  pthread_t *local_8;
  
  wait = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_28 = 0;
  local_64 = 0;
  local_24 = in_ECX;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(in_RDI,0,0x78);
  PaUnixMutex_Initialize
            ((PaUnixMutex *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  paUtilErr_ = pthread_cond_init((pthread_cond_t *)(local_8 + 8),(pthread_condattr_t *)0x0);
  *(uint *)(local_8 + 1) = (uint)(local_20 != 0.0);
  iVar2 = pthread_attr_init(&local_60);
  if (iVar2 == 0) {
    iVar2 = pthread_attr_setscope(&local_60,0);
    if (iVar2 == 0) {
      iVar2 = pthread_create(local_8,&local_60,local_10,local_18);
      if (iVar2 == 0) {
        local_64 = 1;
        if (local_24 != 0) {
          paUtilErr_ = BoostPriority((PaUnixThread *)
                                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
          if (paUtilErr_ < 0) {
            PaUtil_DebugPrint(
                             "Expression \'BoostPriority( self )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 345\n"
                             );
            local_28 = paUtilErr_;
            goto LAB_00112df5;
          }
          pthread_getschedparam(*local_8,&local_68,&local_6c);
        }
        if ((int)local_8[1] == 0) {
          return local_28;
        }
        in_stack_ffffffffffffff74 = 0;
        paUtilErr_ = PaUnixMutex_Lock((PaUnixMutex *)
                                      CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50))
        ;
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaUnixMutex_Lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 361\n"
                           );
          local_28 = paUtilErr_;
        }
        else {
          dVar3 = PaUtil_GetTime();
          local_78 = dVar3 + local_20;
          while( true ) {
            wait = (int)((ulong)dVar3 >> 0x20);
            in_stack_ffffffffffffff67 = 0;
            if ((int)local_8[1] != 0) {
              in_stack_ffffffffffffff67 = in_stack_ffffffffffffff74 != 0 ^ 0xff;
            }
            if ((in_stack_ffffffffffffff67 & 1) == 0) break;
            if (local_20 <= 0.0) {
              in_stack_ffffffffffffff74 =
                   pthread_cond_wait((pthread_cond_t *)(local_8 + 8),
                                     (pthread_mutex_t *)(local_8 + 3));
            }
            else {
              dVar4 = floor(local_78);
              dVar1 = local_78;
              local_88.tv_sec = (__time_t)dVar4;
              dVar4 = floor(local_78);
              local_88.tv_nsec = (long)((dVar1 - dVar4) * 1000000000.0);
              in_stack_ffffffffffffff74 =
                   pthread_cond_timedwait
                             ((pthread_cond_t *)(local_8 + 8),(pthread_mutex_t *)(local_8 + 3),
                              &local_88);
            }
          }
          paUtilErr_ = PaUnixMutex_Unlock((PaUnixMutex *)
                                          CONCAT17(in_stack_ffffffffffffff57,
                                                   in_stack_ffffffffffffff50));
          if (paUtilErr_ < 0) {
            PaUtil_DebugPrint(
                             "Expression \'PaUnixMutex_Unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 381\n"
                             );
            local_28 = paUtilErr_;
          }
          else if (in_stack_ffffffffffffff74 == 0 || in_stack_ffffffffffffff74 == 0x6e) {
            if (in_stack_ffffffffffffff74 != 0x6e) {
              return local_28;
            }
            paUtilErr_ = -0x2703;
            PaUtil_DebugPrint(
                             "Expression \'paTimedOut\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 387\n"
                             );
            local_28 = paUtilErr_;
          }
          else {
            PaUtil_DebugPrint(
                             "Expression \'!res || ETIMEDOUT == res\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 383\n"
                             );
            local_28 = -0x2702;
          }
        }
      }
      else {
        PaUtil_DebugPrint(
                         "Expression \'!pthread_create( &self->thread, &attr, threadFunc, threadArg )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 305\n"
                         );
        local_28 = -0x2702;
      }
    }
    else {
      PaUtil_DebugPrint(
                       "Expression \'!pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 303\n"
                       );
      local_28 = -0x2702;
    }
  }
  else {
    PaUtil_DebugPrint(
                     "Expression \'!pthread_attr_init( &attr )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 301\n"
                     );
    local_28 = -0x2702;
  }
LAB_00112df5:
  if (local_64 != 0) {
    PaUnixThread_Terminate
              ((PaUnixThread *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),wait,
               (PaError *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  }
  return local_28;
}

Assistant:

PaError PaUnixThread_New( PaUnixThread* self, void* (*threadFunc)( void* ), void* threadArg, PaTime waitForChild,
        int rtSched )
{
    PaError result = paNoError;
    pthread_attr_t attr;
    int started = 0;

    memset( self, 0, sizeof (PaUnixThread) );
    PaUnixMutex_Initialize( &self->mtx );
    PA_ASSERT_CALL( pthread_cond_init( &self->cond, NULL ), 0 );

    self->parentWaiting = 0 != waitForChild;

    /* Spawn thread */

/* Temporarily disabled since we should test during configuration for presence of required mman.h header */
#if 0
#if defined _POSIX_MEMLOCK && (_POSIX_MEMLOCK != -1)
    if( rtSched )
    {
        if( mlockall( MCL_CURRENT | MCL_FUTURE ) < 0 )
        {
            int savedErrno = errno;             /* In case errno gets overwritten */
            assert( savedErrno != EINVAL );     /* Most likely a programmer error */
            PA_UNLESS( (savedErrno == EPERM), paInternalError );
            PA_DEBUG(( "%s: Failed locking memory\n", __FUNCTION__ ));
        }
        else
            PA_DEBUG(( "%s: Successfully locked memory\n", __FUNCTION__ ));
    }
#endif
#endif

    PA_UNLESS( !pthread_attr_init( &attr ), paInternalError );
    /* Priority relative to other processes */
    PA_UNLESS( !pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM ), paInternalError );   

    PA_UNLESS( !pthread_create( &self->thread, &attr, threadFunc, threadArg ), paInternalError );
    started = 1;

    if( rtSched )
    {
#if 0
        if( self->useWatchdog )
        {
            int err;
            struct sched_param wdSpm = { 0 };
            /* Launch watchdog, watchdog sets callback thread priority */
            int prio = PA_MIN( self->rtPrio + 4, sched_get_priority_max( SCHED_FIFO ) );
            wdSpm.sched_priority = prio;

            PA_UNLESS( !pthread_attr_init( &attr ), paInternalError );
            PA_UNLESS( !pthread_attr_setinheritsched( &attr, PTHREAD_EXPLICIT_SCHED ), paInternalError );
            PA_UNLESS( !pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM ), paInternalError );
            PA_UNLESS( !pthread_attr_setschedpolicy( &attr, SCHED_FIFO ), paInternalError );
            PA_UNLESS( !pthread_attr_setschedparam( &attr, &wdSpm ), paInternalError );
            if( (err = pthread_create( &self->watchdogThread, &attr, &WatchdogFunc, self )) )
            {
                PA_UNLESS( err == EPERM, paInternalError );
                /* Permission error, go on without realtime privileges */
                PA_DEBUG(( "Failed bumping priority\n" ));
            }
            else
            {
                int policy;
                self->watchdogRunning = 1;
                PA_ENSURE_SYSTEM( pthread_getschedparam( self->watchdogThread, &policy, &wdSpm ), 0 );
                /* Check if priority is right, policy could potentially differ from SCHED_FIFO (but that's alright) */
                if( wdSpm.sched_priority != prio )
                {
                    PA_DEBUG(( "Watchdog priority not set correctly (%d)\n", wdSpm.sched_priority ));
                    PA_ENSURE( paInternalError );
                }
            }
        }
        else
#endif
            PA_ENSURE( BoostPriority( self ) );

        {
            int policy;
            struct sched_param spm;
            pthread_getschedparam(self->thread, &policy, &spm);
        }
    }
    
    if( self->parentWaiting )
    {
        PaTime till;
        struct timespec ts;
        int res = 0;
        PaTime now;

        PA_ENSURE( PaUnixMutex_Lock( &self->mtx ) );

        /* Wait for stream to be started */
        now = PaUtil_GetTime();
        till = now + waitForChild;

        while( self->parentWaiting && !res )
        {
            if( waitForChild > 0 )
            {
                ts.tv_sec = (time_t) floor( till );
                ts.tv_nsec = (long) ((till - floor( till )) * 1e9);
                res = pthread_cond_timedwait( &self->cond, &self->mtx.mtx, &ts );
            }
            else
            {
                res = pthread_cond_wait( &self->cond, &self->mtx.mtx );
            }
        }

        PA_ENSURE( PaUnixMutex_Unlock( &self->mtx ) );

        PA_UNLESS( !res || ETIMEDOUT == res, paInternalError );
        PA_DEBUG(( "%s: Waited for %g seconds for stream to start\n", __FUNCTION__, PaUtil_GetTime() - now ));
        if( ETIMEDOUT == res )
        {
            PA_ENSURE( paTimedOut );
        }
    }

end:
    return result;
error:
    if( started )
    {
        PaUnixThread_Terminate( self, 0, NULL );
    }

    goto end;
}